

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O2

void crnlib::image_utils::renorm_normal_map(image_u8 *img)

{
  byte bVar1;
  color_quad<unsigned_char,_int> cVar2;
  color_quad<unsigned_char,_int> *pcVar3;
  uint in_ECX;
  uint uVar4;
  uint uVar5;
  uint x;
  uint uVar6;
  long lVar7;
  uint uVar8;
  byte bVar11;
  float fVar9;
  float fVar10;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  vec<3U,_float> local_60;
  vec<3U,_float> local_54;
  char local_48;
  char cStack_47;
  byte bStack_46;
  byte bStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  
  local_48 = -0x80;
  cStack_47 = -0x80;
  bStack_46 = 0x80;
  bStack_45 = 0x80;
  cStack_44 = '\0';
  cStack_43 = '\0';
  cStack_42 = '\0';
  cStack_41 = '\0';
  cStack_40 = '\0';
  cStack_3f = '\0';
  cStack_3e = '\0';
  cStack_3d = '\0';
  cStack_3c = '\0';
  cStack_3b = '\0';
  cStack_3a = '\0';
  cStack_39 = '\0';
  for (uVar5 = 0; uVar5 < img->m_height; uVar5 = uVar5 + 1) {
    uVar6 = 0;
    while( true ) {
      if (img->m_width <= uVar6) break;
      pcVar3 = img->m_pPixels;
      uVar8 = img->m_pitch * uVar5 + uVar6;
      cVar2.field_0 =
           (anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3)
           *(anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 *)
            &pcVar3[uVar8].field_0.field_0;
      bVar11 = cVar2.field_0._1_1_;
      auVar12[0] = -(cVar2.field_0._0_1_ == local_48);
      auVar12[1] = -(cVar2.field_0._0_1_ == cStack_47);
      auVar12[2] = -(bVar11 == bStack_46);
      auVar12[3] = -(bVar11 == bStack_45);
      auVar12[4] = -(cVar2.field_0._2_1_ == cStack_44);
      auVar12[5] = -(cVar2.field_0._2_1_ == cStack_43);
      auVar12[6] = -(cVar2.field_0._3_1_ == cStack_42);
      auVar12[7] = -(cVar2.field_0._3_1_ == cStack_41);
      auVar12[8] = -(cStack_40 == '\0');
      auVar12[9] = -(cStack_3f == '\0');
      auVar12[10] = -(cStack_3e == '\0');
      auVar12[0xb] = -(cStack_3d == '\0');
      auVar12[0xc] = -(cStack_3c == '\0');
      auVar12[0xd] = -(cStack_3b == '\0');
      auVar12[0xe] = -(cStack_3a == '\0');
      auVar12[0xf] = -(cStack_39 == '\0');
      auVar12 = pshuflw(auVar12,auVar12,0x50);
      auVar13._0_4_ = auVar12._0_4_;
      auVar13._4_4_ = auVar13._0_4_;
      auVar13._8_4_ = auVar12._4_4_;
      auVar13._12_4_ = auVar12._4_4_;
      uVar4 = movmskpd(in_ECX,auVar13);
      in_ECX = uVar4 ^ 3;
      bVar1 = pcVar3[uVar8].field_0.field_0.b;
      if (bVar1 != 0x80 || (char)in_ECX != '\0') {
        local_60.m_s[2] = (float)bVar1;
        local_60.m_s[0] = (float)((uint)cVar2.field_0 & 0xff);
        local_60.m_s[1] = (float)bVar11;
        vec<3U,_float>::operator*=(&local_60,0.003921569);
        vec<3U,_float>::operator*=(&local_60,2.0);
        vec<3U,_float>::set(&local_54,1.0);
        vec<3U,_float>::operator-=(&local_60,&local_54);
        vec<3U,_float>::clamp(&local_60,-1.0,1.0);
        fVar9 = vec<3U,_float>::length(&local_60);
        if (0.077 <= fVar9) {
          if (0.077 < ABS(fVar9 + -1.0)) {
            vec<3U,_float>::operator/=(&local_60,fVar9);
            for (lVar7 = 0; lVar7 != 3; lVar7 = lVar7 + 1) {
              fVar10 = floorf((local_60.m_s[lVar7] + 1.0) * 0.5 * 255.0 + 0.5);
              fVar9 = 255.0;
              if (fVar10 <= 255.0) {
                fVar9 = fVar10;
              }
              pcVar3[uVar8].field_0.c[lVar7] =
                   (uchar)(int)(float)(~-(uint)(fVar10 < 0.0) & (uint)fVar9);
            }
          }
        }
        else {
          *(undefined2 *)&pcVar3[uVar8].field_0 = 0x8080;
          pcVar3[uVar8].field_0.field_0.b = 0x80;
        }
      }
      uVar6 = uVar6 + 1;
    }
  }
  return;
}

Assistant:

void renorm_normal_map(image_u8& img) {
  for (uint y = 0; y < img.get_height(); y++) {
    for (uint x = 0; x < img.get_width(); x++) {
      color_quad_u8& c = img(x, y);
      if ((c.r == 128) && (c.g == 128) && (c.b == 128))
        continue;

      vec3F v(c.r, c.g, c.b);
      v *= 1.0f / 255.0f;
      v *= 2.0f;
      v -= vec3F(1.0f);
      v.clamp(-1.0f, 1.0f);

      float length = v.length();
      if (length < .077f)
        c.set(128, 128, 128, c.a);
      else if (fabs(length - 1.0f) > .077f) {
        if (length)
          v /= length;

        for (uint i = 0; i < 3; i++)
          c[i] = static_cast<uint8>(math::clamp<float>(floor((v[i] + 1.0f) * .5f * 255.0f + .5f), 0.0f, 255.0f));

        if ((c.r == 128) && (c.g == 128)) {
          if (c.b < 128)
            c.b = 0;
          else
            c.b = 255;
        }
      }
    }
  }
}